

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

bool __thiscall Render::loadResources(Render *this)

{
  Map *this_00;
  undefined8 uVar1;
  SDL_Surface *pSVar2;
  int iVar3;
  int iVar4;
  int j;
  char *pcVar5;
  int iVar6;
  SDL_Rect r;
  
  uVar1 = SDL_RWFromFile("res/cs8x8.bmp","rb");
  pSVar2 = (SDL_Surface *)SDL_LoadBMP_RW(uVar1,1);
  this->charset = pSVar2;
  if (pSVar2 == (SDL_Surface *)0x0) {
    pcVar5 = "res/cs8x8.bmp";
  }
  else {
    SDL_SetColorKey(pSVar2,1,0);
    uVar1 = SDL_RWFromFile("res/tileset.bmp","rb");
    pSVar2 = (SDL_Surface *)SDL_LoadBMP_RW(uVar1,1);
    this->tileset = pSVar2;
    if (pSVar2 == (SDL_Surface *)0x0) {
      pcVar5 = "res/tileset.bmp";
    }
    else {
      iVar6 = 0;
      SDL_SetColorKey(pSVar2,1,0);
      uVar1 = SDL_RWFromFile("res/drums.bmp","rb");
      pSVar2 = (SDL_Surface *)SDL_LoadBMP_RW(uVar1,1);
      this->backgroundTile = pSVar2;
      if (pSVar2 != (SDL_Surface *)0x0) {
        this_00 = this->map;
        iVar3 = this->screen->w / 2 + -0x138;
        this->startX = iVar3;
        this->startY = 0x28;
        iVar4 = (this->screen->h + -0x28) / 0x10 + 1;
        this->rows = iVar4;
        (this->fieldBG).x = iVar3;
        (this->fieldBG).y = 0x28;
        (this->fieldBG).w = 0x270;
        iVar4 = iVar4 * 0x10;
        (this->fieldBG).h = iVar4;
        Map::setField(this_00,0x238,iVar4 + -0x10);
        pSVar2 = (SDL_Surface *)
                 SDL_CreateRGBSurface
                           (0,(this->fieldBG).w,(this->fieldBG).h,0x20,0xff0000,0xff00,0xff,
                            0xffffffffff000000);
        this->background = pSVar2;
        pSVar2 = this->backgroundTile;
        for (; iVar6 <= (this->fieldBG).w / pSVar2->w; iVar6 = iVar6 + 1) {
          for (iVar3 = 0; iVar4 = pSVar2->h, iVar3 <= (this->fieldBG).h / iVar4; iVar3 = iVar3 + 1)
          {
            r.w = pSVar2->w;
            r.x = r.w * iVar6;
            r.y = iVar4 * iVar3;
            r.h = iVar4;
            SDL_UpperBlit(pSVar2,0,this->background,&r);
            pSVar2 = this->backgroundTile;
          }
        }
        parseTileset(this,this->tileset);
        return true;
      }
      pcVar5 = "res/drums.bmp";
    }
  }
  printf("Cannot load: %s\n",pcVar5);
  return false;
}

Assistant:

bool Render::loadResources(){
    // ASCII Charset
    charset = SDL_LoadBMP(RESOURCE_CHARSET);
    if(!charset){
        printf("Cannot load: %s\n", RESOURCE_CHARSET);
        return false;
    }
    SDL_SetColorKey(charset, true, 0x000000);

    // Tileset
    tileset = SDL_LoadBMP(RESOURCE_TILESET);
    if(!tileset){
        printf("Cannot load: %s\n", RESOURCE_TILESET);
        return false;
    }
    SDL_SetColorKey(tileset, true, 0x000000);

    // Background Tile
    backgroundTile = SDL_LoadBMP(RESOURCE_BACKGROUND);
    if(!backgroundTile){
        printf("Cannot load: %s\n", RESOURCE_BACKGROUND);
        return false;
    }

    // Calculate variables
    startX = screen->w/2 - ((BLOCKS_W+2)*BLOCK_W)/2;
    startY = 40;
    rows = (screen->h - startY)/BLOCK_H + 1;
    fieldBG.x = startX;
    fieldBG.y = startY;
    fieldBG.w = (BLOCKS_W+2)*BLOCK_W;
    fieldBG.h = (rows)*BLOCK_H;
    map->setField(fieldBG.w - 2*BLOCK_W - BALL_W, fieldBG.h - BLOCK_H);

    // Pre-render background
    SDL_Rect r;
    background = SDL_CreateRGBSurface(0, fieldBG.w, fieldBG.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
    for(int i=0; i<(fieldBG.w/backgroundTile->w + 1); i++)
        for(int j=0; j<(fieldBG.h/backgroundTile->h +1); j++){
            r.x = i*backgroundTile->w;
            r.y = j*backgroundTile->h;
            r.w = backgroundTile->w;
            r.h = backgroundTile->h;
            SDL_BlitSurface(backgroundTile, nullptr, background, &r);
        }

    parseTileset(tileset);

    return true;
}